

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_math.cpp
# Opt level: O1

void __thiscall strain_example3_Test::~strain_example3_Test(strain_example3_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(strain, example3)
{
    measurement deltaLength = 0.00001 * m;
    measurement length = 1 * m;

    auto strain = divides(deltaLength, length);
    EXPECT_EQ(to_string(strain), "1e-05 strain");

    // applied to a 10 ft bar
    auto distortion = multiplies(strain, (10 * ft));
    EXPECT_EQ(to_string(distortion), "0.0001 ft");
}